

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>,serialize_tests::Base,std::allocator<serialize_tests::Base>>
               (ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *os,
               vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *v)

{
  long lVar1;
  vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *in_RSI;
  ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VectorFormatter<DefaultFormatter>,std::vector<serialize_tests::Base,std::allocator<serialize_tests::Base>>const&>
            (in_RSI);
  Serialize<ParamsStream<DataStream_&,_serialize_tests::BaseFormat>,_Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_&>_>
            (in_RDI,(Wrapper<VectorFormatter<DefaultFormatter>,_const_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_&>
                     *)0xac97c6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}